

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_type __n;
  char *filename;
  char *pcVar4;
  bool bVar5;
  string input_text;
  vector<unsigned_long,_std::allocator<unsigned_long>_> binary;
  ofstream outfp;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [14];
  ios_base local_128 [272];
  
  if (1 < argc) {
    iVar3 = 1;
    filename = (char *)0x0;
    pcVar4 = (char *)0x0;
    do {
      pcVar1 = argv[iVar3];
      if (((*pcVar1 == '-') && (pcVar1[1] == 'o')) && (pcVar1[2] == '\0')) {
        if (pcVar4 != (char *)0x0) {
          pcVar4 = "command line output file already provided";
          goto LAB_0011d788;
        }
        iVar3 = iVar3 + 1;
        if (iVar3 == argc) {
          pcVar4 = "expected command line syntax: \"-o\" <output file>";
          goto LAB_0011d788;
        }
        pcVar4 = argv[iVar3];
      }
      else {
        bVar5 = filename != (char *)0x0;
        filename = pcVar1;
        if (bVar5) {
          pcVar4 = "command line input file already provided";
          goto LAB_0011d788;
        }
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < argc);
    if (filename != (char *)0x0) {
      if (pcVar4 != (char *)0x0) {
        std::ifstream::ifstream(local_220,filename,_S_bin);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          fatal_error((char *)0x0,"%s: failed to open",filename);
        }
        std::istream::seekg((long)local_220,_S_beg);
        __n = std::istream::tellg();
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_258,__n,' ');
        std::istream::seekg((long)local_220,_S_beg);
        std::istream::read(local_220,(long)local_258._M_dataplus._M_p);
        std::ifstream::~ifstream(local_220);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_220,local_258._M_dataplus._M_p,&local_259);
        nxas::assemble(&local_238,(string *)local_220,filename);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._0_8_ != local_210) {
          operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
        }
        std::ofstream::ofstream(local_220,pcVar4,_S_bin);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          std::ostream::write(local_220,
                              (long)local_238.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          local_220._0_8_ = _VTT;
          *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = __filebuf;
          std::filebuf::~filebuf((filebuf *)(local_220 + 8));
          std::ios_base::~ios_base(local_128);
          if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          return 0;
        }
        fatal_error("%s: failed to open",pcVar4);
      }
      pcVar4 = "no output file";
      goto LAB_0011d788;
    }
  }
  pcVar4 = "no input file";
LAB_0011d788:
  fatal_error(pcVar4);
}

Assistant:

int main(int argc, char** argv)
{
    const char* input_file = nullptr;
    const char* output_file = nullptr;

    for (int i = 1; i < argc; ++i) {
        // Parse output file
        if (std::strcmp(argv[i], "-o") == 0) {
            if (output_file) {
                fatal_error("command line output file already provided");
            }
            if (++i == argc) {
                fatal_error("expected command line syntax: \"-o\" <output file>");
            }
            output_file = argv[i];
            continue;
        }
        // There's no modifier, it's an input file
        if (input_file) {
            fatal_error("command line input file already provided");
        }
        input_file = argv[i];
    }
    if (!input_file) {
        fatal_error("no input file");
    }
    if (!output_file) {
        fatal_error("no output file");
    }
    const std::string input_text = read_file(input_file);
    const std::vector<uint64_t> binary = nxas::assemble(input_text.c_str(), input_file);
    try {
        std::ofstream outfp(output_file, std::ios::binary);
        if (!outfp.is_open()) {
            fatal_error("%s: failed to open", output_file);
        }
        outfp.write(reinterpret_cast<const char*>(binary.data()), binary.size() * sizeof(uint64_t));
    } catch (const std::ios_base::failure& e) {
        fatal_error("failed to write output file: %s", e.what());
    }
}